

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

string * __thiscall
wabt::anon_unknown_0::CWriter::DefineLocalScopeName
          (string *__return_storage_ptr__,CWriter *this,string *name)

{
  size_type in_R8;
  string_view sVar1;
  string_view name_00;
  char *in_stack_ffffffffffffff98;
  _Alloc_hider in_stack_ffffffffffffffa0;
  char local_50 [16];
  _Alloc_hider local_40;
  char local_30 [16];
  
  sVar1.size_ = (size_type)in_stack_ffffffffffffffa0._M_p;
  sVar1.data_ = in_stack_ffffffffffffff98;
  sVar1 = StripLeadingDollar(sVar1);
  name_00.size_ = in_R8;
  name_00.data_ = (char *)sVar1.size_;
  DefineName(__return_storage_ptr__,(CWriter *)&this->local_syms_,(SymbolSet *)sVar1.data_,name_00);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&stack0xffffffffffffffa0,name,__return_storage_ptr__);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&this->local_sym_map_,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&stack0xffffffffffffffa0);
  if (local_40._M_p != local_30) {
    operator_delete(local_40._M_p);
  }
  if (in_stack_ffffffffffffffa0._M_p != local_50) {
    operator_delete(in_stack_ffffffffffffffa0._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::DefineLocalScopeName(const std::string& name) {
  std::string unique = DefineName(&local_syms_, StripLeadingDollar(name));
  local_sym_map_.insert(SymbolMap::value_type(name, unique));
  return unique;
}